

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_log.cpp
# Opt level: O0

void duckdb::WriteLogFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  uint uVar2;
  WriteLogBindData *pWVar3;
  ulong uVar4;
  ClientContext *sel;
  type size;
  undefined8 uVar5;
  UnifiedVectorFormat *in_RDX;
  DataChunk *in_RDI;
  string_t *input_data;
  UnifiedVectorFormat idata;
  WriteLogBindData *info;
  BoundFunctionExpression *func_expr;
  char *in_stack_fffffffffffffe18;
  UnifiedVectorFormat *in_stack_fffffffffffffe20;
  LogicalType *in_stack_fffffffffffffe28;
  UnifiedVectorFormat *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  LogicalTypeId id;
  LogicalType *in_stack_fffffffffffffe40;
  allocator *paVar6;
  BaseExpression *in_stack_fffffffffffffe60;
  pointer in_stack_fffffffffffffe68;
  ClientContext *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  InvalidInputException *in_stack_fffffffffffffe90;
  SelectionVector *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffea4;
  undefined8 in_stack_fffffffffffffea8;
  string_t *psVar8;
  LogLevel level;
  DatabaseInstance *in_stack_fffffffffffffeb0;
  UnifiedVectorFormat *in_stack_fffffffffffffee0;
  idx_t in_stack_fffffffffffffee8;
  Vector *in_stack_fffffffffffffef0;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  string_t *local_88;
  ClientContext *local_70;
  Value *in_stack_ffffffffffffff98;
  Vector *in_stack_ffffffffffffffa0;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffea8 >> 0x38);
  id = (LogicalTypeId)((ulong)in_stack_fffffffffffffe38 >> 0x38);
  BaseExpression::Cast<duckdb::BoundFunctionExpression>(in_stack_fffffffffffffe60);
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator->
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_fffffffffffffe20);
  pWVar3 = FunctionData::Cast<duckdb::WriteLogBindData>((FunctionData *)in_stack_fffffffffffffe20);
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffe30);
  vector<duckdb::Vector,_true>::operator[]
            ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe20,
             (size_type)in_stack_fffffffffffffe18);
  DataChunk::size(in_RDI);
  Vector::ToUnifiedFormat
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  local_88 = UnifiedVectorFormat::GetData<duckdb::string_t>((UnifiedVectorFormat *)&local_70);
  if ((pWVar3->disable_logging & 1U) == 0) {
    uVar4 = ::std::__cxx11::string::empty();
    if (((uVar4 & 1) != 0) ||
       (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), bVar1)) {
      optional_ptr<duckdb::ClientContext,_true>::operator*
                ((optional_ptr<duckdb::ClientContext,_true> *)in_stack_fffffffffffffe20);
      uVar2 = (uint)pWVar3->level;
      psVar8 = local_88;
      DataChunk::size(in_RDI);
      WriteLogValues<duckdb::ClientContext_const>
                (local_70,(LogLevel)((ulong)psVar8 >> 0x38),
                 (string_t *)CONCAT44(uVar2,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98,
                 (idx_t)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffea0);
      if (bVar1) {
        sel = optional_ptr<duckdb::ClientContext,_true>::operator->
                        ((optional_ptr<duckdb::ClientContext,_true> *)in_stack_fffffffffffffe20);
        size = shared_ptr<duckdb::DatabaseInstance,_true>::operator*
                         ((shared_ptr<duckdb::DatabaseInstance,_true> *)in_stack_fffffffffffffe20);
        DataChunk::size(in_RDI);
        WriteLogValues<duckdb::DatabaseInstance_const>
                  (in_stack_fffffffffffffeb0,level,
                   (string_t *)CONCAT44(in_stack_fffffffffffffea4,uVar7),(SelectionVector *)sel,
                   (idx_t)size,(string *)local_70);
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        if (!bVar1) {
          uVar5 = __cxa_allocate_exception(0x10);
          paVar6 = &local_a9;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_a8,
                     "write_log: \'scope\' argument unknown: \'%s\'. Valid values are [connection, database, file_opener]"
                     ,paVar6);
          ::std::__cxx11::string::string(local_d0,(string *)&pWVar3->scope);
          InvalidInputException::InvalidInputException<std::__cxx11::string>
                    (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
          __cxa_throw(uVar5,&InvalidInputException::typeinfo,
                      InvalidInputException::~InvalidInputException);
        }
        in_stack_fffffffffffffe70 =
             optional_ptr<duckdb::ClientContext,_true>::operator->
                       ((optional_ptr<duckdb::ClientContext,_true> *)in_stack_fffffffffffffe20);
        in_stack_fffffffffffffe68 =
             unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::
             operator->((unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>
                         *)in_stack_fffffffffffffe20);
        unique_ptr<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>,_true>::operator*
                  ((unique_ptr<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>,_true> *)
                   in_stack_fffffffffffffe20);
        DataChunk::size(in_RDI);
        WriteLogValues<duckdb::FileOpener_const>
                  ((FileOpener *)in_stack_fffffffffffffeb0,level,
                   (string_t *)CONCAT44(in_stack_fffffffffffffea4,uVar7),in_stack_fffffffffffffe98,
                   (idx_t)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      }
    }
  }
  if (pWVar3->output_col == 0xffffffffffffffff) {
    LogicalType::LogicalType(in_stack_fffffffffffffe40,id);
    Value::Value((Value *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    Vector::Reference(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Value::~Value((Value *)in_RDX);
    LogicalType::~LogicalType((LogicalType *)0x13e0114);
  }
  else {
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe20,
               (size_type)in_stack_fffffffffffffe18);
    Vector::Reference((Vector *)in_stack_fffffffffffffe70,(Vector *)in_stack_fffffffffffffe68);
    in_RDX = in_stack_fffffffffffffe20;
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(in_RDX);
  return;
}

Assistant:

static void WriteLogFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() >= 1);

	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	const auto &info = func_expr.bind_info->Cast<WriteLogBindData>();

	UnifiedVectorFormat idata;
	args.data[0].ToUnifiedFormat(args.size(), idata);

	auto input_data = UnifiedVectorFormat::GetData<string_t>(idata);

	if (!info.disable_logging) {
		if (info.scope.empty() || info.scope == "connection") {
			WriteLogValues<const ClientContext>(*info.context, info.level, input_data, idata.sel, args.size(),
			                                    info.type);
		} else if (info.scope == "database") {
			WriteLogValues<const DatabaseInstance>(*info.context->db, info.level, input_data, idata.sel, args.size(),
			                                       info.type);
		} else if (info.scope == "file_opener") {
			WriteLogValues<const FileOpener>(*info.context->client_data->file_opener, info.level, input_data, idata.sel,
			                                 args.size(), info.type);
		} else {
			throw InvalidInputException(
			    "write_log: 'scope' argument unknown: '%s'. Valid values are [connection, database, file_opener]",
			    info.scope);
		}
	}

	if (info.output_col != DConstants::INVALID_INDEX) {
		result.Reference(args.data[info.output_col]);
	} else {
		result.Reference(Value(LogicalType::VARCHAR));
	}
}